

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_INSTCTRL(TT_ExecContext exc,FT_Long *args)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  FT_ULong Kf;
  FT_ULong L;
  FT_ULong K;
  FT_Long *args_local;
  TT_ExecContext exc_local;
  
  uVar1 = args[1];
  lVar2 = *args;
  if ((uVar1 == 0) || (3 < uVar1)) {
    if (exc->pedantic_hinting != '\0') {
      exc->error = 0x86;
    }
  }
  else {
    iVar3 = 1 << ((char)uVar1 - 1U & 0x1f);
    if ((lVar2 == 0) || (lVar2 == iVar3)) {
      if (exc->iniRange == 2) {
        (exc->GS).instruct_control = (exc->GS).instruct_control & ((byte)iVar3 ^ 0xff);
        (exc->GS).instruct_control = (exc->GS).instruct_control | (byte)lVar2;
      }
      else if ((exc->iniRange == 3) && (uVar1 == 3)) {
        if (*(int *)&(exc->face->root).driver[2].root.library == 0x28) {
          exc->backward_compatibility = (lVar2 == 4 ^ 0xffU) & 1;
        }
      }
      else if (exc->pedantic_hinting != '\0') {
        exc->error = 0x86;
      }
    }
    else if (exc->pedantic_hinting != '\0') {
      exc->error = 0x86;
    }
  }
  return;
}

Assistant:

static void
  Ins_INSTCTRL( TT_ExecContext  exc,
                FT_Long*        args )
  {
    FT_ULong  K, L, Kf;


    K = (FT_ULong)args[1];
    L = (FT_ULong)args[0];

    /* selector values cannot be `OR'ed;                 */
    /* they are indices starting with index 1, not flags */
    if ( K < 1 || K > 3 )
    {
      if ( exc->pedantic_hinting )
        exc->error = FT_THROW( Invalid_Reference );
      return;
    }

    /* convert index to flag value */
    Kf = 1 << ( K - 1 );

    if ( L != 0 )
    {
      /* arguments to selectors look like flag values */
      if ( L != Kf )
      {
        if ( exc->pedantic_hinting )
          exc->error = FT_THROW( Invalid_Reference );
        return;
      }
    }

    /* INSTCTRL should only be used in the CVT program */
    if ( exc->iniRange == tt_coderange_cvt )
    {
      exc->GS.instruct_control &= ~(FT_Byte)Kf;
      exc->GS.instruct_control |= (FT_Byte)L;
    }

    /* except to change the subpixel flags temporarily */
    else if ( exc->iniRange == tt_coderange_glyph && K == 3 )
    {
#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
      /* INSTCTRL modifying flag 3 also has an effect */
      /* outside of the CVT program                   */
      if ( SUBPIXEL_HINTING_INFINALITY )
        exc->ignore_x_mode = !FT_BOOL( L == 4 );
#endif

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_MINIMAL
      /* Native ClearType fonts sign a waiver that turns off all backward  */
      /* compatibility hacks and lets them program points to the grid like */
      /* it's 1996.  They might sign a waiver for just one glyph, though.  */
      if ( SUBPIXEL_HINTING_MINIMAL )
        exc->backward_compatibility = !FT_BOOL( L == 4 );
#endif
    }
    else if ( exc->pedantic_hinting )
      exc->error = FT_THROW( Invalid_Reference );
  }